

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case1601(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1ba;
  allocator<char> local_1b9;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1b8;
  SyntaxKind local_19e [3];
  string local_198;
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"( x ) ( )",&local_1b9);
  Expectation::Expectation(&local_178);
  local_19e[0] = CallExpression;
  local_19e[1] = ParenthesizedExpression;
  local_19e[2] = 0x432;
  __l._M_len = 3;
  __l._M_array = local_19e;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1b8,__l,
             &local_1ba);
  pEVar1 = Expectation::AST(&local_178,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_1b8);
  Expectation::Expectation(&local_c0,pEVar1);
  parseExpression(this,&local_198,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1b8);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  return;
}

Assistant:

void ParserTester::case1601()
{
    parseExpression("( x ) ( )",
                    Expectation().AST( { SyntaxKind::CallExpression,
                                         SyntaxKind::ParenthesizedExpression,
                                         SyntaxKind::IdentifierName }));
}